

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.h
# Opt level: O2

void __thiscall
irr::video::CNullDriver::SHWBufferLink::SHWBufferLink(SHWBufferLink *this,IMeshBuffer *_MeshBuffer)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  _func_int *UNRECOVERED_JUMPTABLE;
  
  this->_vptr_SHWBufferLink = (_func_int **)&PTR__SHWBufferLink_00281e58;
  this->MeshBuffer = _MeshBuffer;
  (this->listPosition)._M_node = (_List_node_base *)0x0;
  this->ChangedID_Vertex = 0;
  this->ChangedID_Index = 0;
  this->Mapped_Vertex = EHM_NEVER;
  this->Mapped_Index = EHM_NEVER;
  if (_MeshBuffer != (IMeshBuffer *)0x0) {
    pp_Var1 = _MeshBuffer->_vptr_IMeshBuffer;
    p_Var2 = pp_Var1[-3];
    *(int *)(&_MeshBuffer->field_0x10 + (long)p_Var2) =
         *(int *)(&_MeshBuffer->field_0x10 + (long)p_Var2) + 1;
    UNRECOVERED_JUMPTABLE = pp_Var1[0x1a];
    (*UNRECOVERED_JUMPTABLE)(_MeshBuffer,this,p_Var2,UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

SHWBufferLink(const scene::IMeshBuffer *_MeshBuffer) :
				MeshBuffer(_MeshBuffer),
				ChangedID_Vertex(0), ChangedID_Index(0),
				Mapped_Vertex(scene::EHM_NEVER), Mapped_Index(scene::EHM_NEVER)
		{
			if (MeshBuffer) {
				MeshBuffer->grab();
				MeshBuffer->setHWBuffer(reinterpret_cast<void *>(this));
			}
		}